

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NDOLoader.cpp
# Opt level: O3

void __thiscall
Assimp::NDOImporter::InternReadFile
          (NDOImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  pointer *ppEVar1;
  pointer *ppVVar2;
  _Rb_tree_color _Var3;
  iterator __position;
  pointer pFVar4;
  iterator __position_00;
  pointer pVVar5;
  pointer pEVar6;
  bool bVar7;
  bool bVar8;
  pointer paVar9;
  int8_t *piVar10;
  byte bVar11;
  char cVar12;
  uchar uVar13;
  unsigned_short uVar14;
  unsigned_short uVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  undefined4 extraout_var;
  Logger *pLVar20;
  ulong uVar21;
  aiNode *this_00;
  aiNode **__s;
  aiMesh **__s_00;
  aiNode *this_01;
  mapped_type *pmVar22;
  aiMesh *this_02;
  ulong *puVar23;
  aiFace *paVar24;
  uint *puVar25;
  undefined8 uVar26;
  aiVector3D *paVar27;
  runtime_error *this_03;
  aiFace *paVar28;
  Edge *edge;
  long lVar29;
  pointer pEVar30;
  mapped_type mVar31;
  pointer __src;
  size_t __n;
  pointer puVar32;
  ulong uVar33;
  pointer pOVar34;
  float fVar35;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> vertices;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  vector<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_> objects;
  StreamReaderBE reader;
  FaceTable face_table;
  ulong local_288;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_278;
  aiFace *local_258;
  uint local_24c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_248;
  aiScene *local_228;
  undefined1 local_220 [32];
  aiNode *local_200;
  pointer local_1f8;
  aiVector3D **local_1f0;
  aiNode **local_1e8;
  StreamReader<true,_false> local_1e0;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  undefined8 uStack_188;
  uint uStack_180;
  undefined4 uStack_17c;
  ios_base local_138 [264];
  
  local_228 = pScene;
  local_1a8._0_8_ = &local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"rb","");
  iVar16 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,local_1a8._0_8_);
  StreamReader<true,_false>::StreamReader
            (&local_1e0,(IOStream *)CONCAT44(extraout_var,iVar16),false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._0_8_ != &local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198._M_allocated_capacity + 1);
  }
  piVar10 = local_1e0.current;
  StreamReader<true,_false>::IncPtr(&local_1e0,9);
  iVar16 = strncmp("nendo ",piVar10,6);
  if (iVar16 != 0) {
    this_03 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1a8._0_8_ = &local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"Not a Nendo file; magic signature missing","");
    std::runtime_error::runtime_error(this_03,(string *)local_1a8);
    *(undefined ***)this_03 = &PTR__runtime_error_0080bf48;
    __cxa_throw(this_03,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar11 = piVar10[6];
  iVar17 = -(bVar11 - 0x31);
  iVar16 = iVar17;
  if (bVar11 == 0x31) {
    if ((byte)piVar10[7] - 0x2e == 0) {
      iVar16 = 0x30 - (uint)(byte)piVar10[8];
    }
    else {
      iVar16 = -((byte)piVar10[7] - 0x2e);
    }
    if (iVar16 != 0) {
      if ((byte)piVar10[7] - 0x2e == 0) {
        iVar16 = 0x31 - (uint)(byte)piVar10[8];
      }
      else {
        iVar16 = -((byte)piVar10[7] - 0x2e);
      }
      goto LAB_004927b5;
    }
    pLVar20 = DefaultLogger::get();
    Logger::info(pLVar20,"NDO file format is 1.0");
    bVar8 = true;
  }
  else {
LAB_004927b5:
    if (iVar16 != 0) {
      if (bVar11 == 0x31) {
        if ((byte)piVar10[7] - 0x2e == 0) {
          iVar17 = 0x32 - (uint)(byte)piVar10[8];
        }
        else {
          iVar17 = -((byte)piVar10[7] - 0x2e);
        }
      }
      if (iVar17 == 0) {
        pLVar20 = DefaultLogger::get();
        Logger::info(pLVar20,"NDO file format is 1.2");
      }
      else {
        pLVar20 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[65]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8
                   ,(char (*) [65])
                    "Unrecognized nendo file format version, continuing happily ... :");
        local_278.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)(piVar10 + 6);
        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                  ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_1a8,
                   (char **)&local_278);
        std::__cxx11::stringbuf::str();
        Logger::warn(pLVar20,(char *)local_220._0_8_);
        if ((pointer)local_220._0_8_ != (pointer)(local_220 + 0x10)) {
          operator_delete((void *)local_220._0_8_,
                          (ulong)((long)&(((string *)local_220._16_8_)->_M_dataplus)._M_p + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      bVar7 = true;
      bVar8 = false;
      goto LAB_004928b7;
    }
    pLVar20 = DefaultLogger::get();
    Logger::info(pLVar20,"NDO file format is 1.1");
    bVar8 = false;
  }
  bVar7 = false;
LAB_004928b7:
  StreamReader<true,_false>::IncPtr(&local_1e0,2);
  if (bVar7) {
    StreamReader<true,_false>::IncPtr(&local_1e0,2);
  }
  bVar11 = StreamReader<true,_false>::Get<unsigned_char>(&local_1e0);
  std::vector<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>::vector
            ((vector<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_> *)
             local_220,(ulong)bVar11,(allocator_type *)local_1a8);
  if (local_220._8_8_ != local_220._0_8_) {
    local_288 = 0;
    do {
      cVar12 = StreamReader<true,_false>::Get<signed_char>(&local_1e0);
      if (cVar12 != '\0') {
        pOVar34 = (pointer)(local_220._0_8_ + local_288 * 0x68);
        if (bVar7) {
          uVar18 = StreamReader<true,_false>::Get<unsigned_int>(&local_1e0);
        }
        else {
          uVar14 = StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
          uVar18 = (uint)uVar14;
        }
        piVar10 = local_1e0.current;
        StreamReader<true,_false>::IncPtr(&local_1e0,(ulong)(uVar18 + 0x4c));
        local_1a8._0_8_ = &local_198;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,piVar10,piVar10 + uVar18);
        std::__cxx11::string::operator=((string *)pOVar34,(string *)local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._0_8_ != &local_198) {
          operator_delete((void *)local_1a8._0_8_,local_198._M_allocated_capacity + 1);
        }
        if (bVar7) {
          uVar18 = StreamReader<true,_false>::Get<unsigned_int>(&local_1e0);
        }
        else {
          uVar14 = StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
          uVar18 = (uint)uVar14;
        }
        std::vector<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>::reserve
                  (&pOVar34->edges,(ulong)uVar18);
        local_258 = (aiFace *)CONCAT44(local_258._4_4_,uVar18);
        if (uVar18 != 0) {
          iVar16 = 0;
          do {
            uStack_188._0_4_ = 0;
            uStack_188._4_1_ = '\0';
            uStack_188._5_1_ = '\0';
            uStack_188._6_1_ = '\0';
            uStack_188._7_1_ = '\0';
            uStack_180 = 0;
            local_198._M_allocated_capacity = 0;
            local_198._8_4_ = 0;
            local_198._12_4_ = 0;
            local_1a8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_1a8._8_8_ = 0;
            __position._M_current =
                 (pOVar34->edges).
                 super__Vector_base<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (pOVar34->edges).
                super__Vector_base<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>::
              _M_realloc_insert<Assimp::NDOImporter::Edge>
                        (&pOVar34->edges,__position,(Edge *)local_1a8);
            }
            else {
              *(undefined8 *)((__position._M_current)->edge + 7) = 0;
              (__position._M_current)->color[0] = '\0';
              (__position._M_current)->color[1] = '\0';
              (__position._M_current)->color[2] = '\0';
              (__position._M_current)->color[3] = '\0';
              (__position._M_current)->color[4] = '\0';
              (__position._M_current)->color[5] = '\0';
              (__position._M_current)->color[6] = '\0';
              (__position._M_current)->color[7] = '\0';
              (__position._M_current)->edge[4] = 0;
              (__position._M_current)->edge[5] = 0;
              (__position._M_current)->edge[6] = 0;
              (__position._M_current)->edge[7] = 0;
              (__position._M_current)->edge[0] = 0;
              (__position._M_current)->edge[1] = 0;
              (__position._M_current)->edge[2] = 0;
              (__position._M_current)->edge[3] = 0;
              ppEVar1 = &(pOVar34->edges).
                         super__Vector_base<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppEVar1 = *ppEVar1 + 1;
            }
            pEVar30 = (pOVar34->edges).
                      super__Vector_base<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            lVar29 = -0xb;
            do {
              if (bVar7) {
                uVar18 = StreamReader<true,_false>::Get<unsigned_int>(&local_1e0);
              }
              else {
                uVar14 = StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
                uVar18 = (uint)uVar14;
              }
              pEVar30->edge[lVar29] = uVar18;
              lVar29 = lVar29 + 1;
            } while (lVar29 != -3);
            uVar18 = 0;
            if (!bVar8) {
              bVar11 = StreamReader<true,_false>::Get<unsigned_char>(&local_1e0);
              uVar18 = (uint)bVar11;
            }
            pEVar30[-1].hard = uVar18;
            lVar29 = -8;
            do {
              uVar13 = StreamReader<true,_false>::Get<unsigned_char>(&local_1e0);
              *(uchar *)((long)pEVar30->edge + lVar29) = uVar13;
              lVar29 = lVar29 + 1;
            } while (lVar29 != 0);
            iVar16 = iVar16 + 1;
          } while (iVar16 != (int)local_258);
        }
        if (bVar7) {
          uVar18 = StreamReader<true,_false>::Get<unsigned_int>(&local_1e0);
        }
        else {
          uVar14 = StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
          uVar18 = (uint)uVar14;
        }
        std::vector<Assimp::NDOImporter::Face,_std::allocator<Assimp::NDOImporter::Face>_>::reserve
                  (&pOVar34->faces,(ulong)uVar18);
        for (; uVar18 != 0; uVar18 = uVar18 - 1) {
          local_1a8._0_8_ = local_1a8._0_8_ & 0xffffffff00000000;
          std::vector<Assimp::NDOImporter::Face,_std::allocator<Assimp::NDOImporter::Face>_>::
          emplace_back<Assimp::NDOImporter::Face>(&pOVar34->faces,(Face *)local_1a8);
          pFVar4 = (pOVar34->faces).
                   super__Vector_base<Assimp::NDOImporter::Face,_std::allocator<Assimp::NDOImporter::Face>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (bVar7) {
            uVar19 = StreamReader<true,_false>::Get<unsigned_int>(&local_1e0);
          }
          else {
            uVar14 = StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
            uVar19 = (uint)uVar14;
          }
          pFVar4[-1].elem = uVar19;
        }
        if (bVar7) {
          uVar18 = StreamReader<true,_false>::Get<unsigned_int>(&local_1e0);
        }
        else {
          uVar14 = StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
          uVar18 = (uint)uVar14;
        }
        std::vector<Assimp::NDOImporter::Vertex,_std::allocator<Assimp::NDOImporter::Vertex>_>::
        reserve(&pOVar34->vertices,(ulong)uVar18);
        for (; uVar18 != 0; uVar18 = uVar18 - 1) {
          local_1a8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_1a8._8_8_ = 0;
          __position_00._M_current =
               (pOVar34->vertices).
               super__Vector_base<Assimp::NDOImporter::Vertex,_std::allocator<Assimp::NDOImporter::Vertex>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position_00._M_current ==
              (pOVar34->vertices).
              super__Vector_base<Assimp::NDOImporter::Vertex,_std::allocator<Assimp::NDOImporter::Vertex>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<Assimp::NDOImporter::Vertex,_std::allocator<Assimp::NDOImporter::Vertex>_>::
            _M_realloc_insert<Assimp::NDOImporter::Vertex>
                      (&pOVar34->vertices,__position_00,(Vertex *)local_1a8);
          }
          else {
            (__position_00._M_current)->num = 0;
            ((__position_00._M_current)->val).x = 0.0;
            ((__position_00._M_current)->val).y = 0.0;
            ((__position_00._M_current)->val).z = 0.0;
            ppVVar2 = &(pOVar34->vertices).
                       super__Vector_base<Assimp::NDOImporter::Vertex,_std::allocator<Assimp::NDOImporter::Vertex>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppVVar2 = *ppVVar2 + 1;
          }
          pVVar5 = (pOVar34->vertices).
                   super__Vector_base<Assimp::NDOImporter::Vertex,_std::allocator<Assimp::NDOImporter::Vertex>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (bVar7) {
            uVar19 = StreamReader<true,_false>::Get<unsigned_int>(&local_1e0);
          }
          else {
            uVar14 = StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
            uVar19 = (uint)uVar14;
          }
          pVVar5[-1].num = uVar19;
          fVar35 = StreamReader<true,_false>::Get<float>(&local_1e0);
          pVVar5[-1].val.x = fVar35;
          fVar35 = StreamReader<true,_false>::Get<float>(&local_1e0);
          pVVar5[-1].val.y = fVar35;
          fVar35 = StreamReader<true,_false>::Get<float>(&local_1e0);
          pVVar5[-1].val.z = fVar35;
        }
        if (bVar7) {
          uVar18 = StreamReader<true,_false>::Get<unsigned_int>(&local_1e0);
        }
        else {
          uVar14 = StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
          uVar18 = (uint)uVar14;
        }
        for (; uVar18 != 0; uVar18 = uVar18 - 1) {
          if (bVar7) {
            StreamReader<true,_false>::Get<unsigned_int>(&local_1e0);
          }
          else {
            StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
          }
        }
        if (bVar7) {
          uVar18 = StreamReader<true,_false>::Get<unsigned_int>(&local_1e0);
        }
        else {
          uVar14 = StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
          uVar18 = (uint)uVar14;
        }
        for (; uVar18 != 0; uVar18 = uVar18 - 1) {
          if (bVar7) {
            StreamReader<true,_false>::Get<unsigned_int>(&local_1e0);
          }
          else {
            StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
          }
        }
        uVar13 = StreamReader<true,_false>::Get<unsigned_char>(&local_1e0);
        if (uVar13 != '\0') {
          uVar14 = StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
          uVar15 = StreamReader<true,_false>::Get<unsigned_short>(&local_1e0);
          if ((uint)uVar15 * (uint)uVar14 != 0) {
            uVar18 = 0;
            do {
              bVar11 = StreamReader<true,_false>::Get<unsigned_char>(&local_1e0);
              StreamReader<true,_false>::Get<unsigned_char>(&local_1e0);
              StreamReader<true,_false>::Get<unsigned_char>(&local_1e0);
              StreamReader<true,_false>::Get<unsigned_char>(&local_1e0);
              uVar18 = uVar18 + bVar11;
            } while (uVar18 < (uint)uVar15 * (uint)uVar14);
          }
        }
      }
      local_288 = (ulong)((int)local_288 + 1);
      uVar21 = ((long)(local_220._8_8_ - local_220._0_8_) >> 3) * 0x4ec4ec4ec4ec4ec5;
    } while (local_288 <= uVar21 && uVar21 - local_288 != 0);
  }
  this_00 = (aiNode *)operator_new(0x478);
  local_200 = this_00;
  local_1a8._0_8_ = &local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"$NDODummyRoot","");
  aiNode::aiNode(this_00,(string *)local_1a8);
  local_228->mRootNode = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._0_8_ != &local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198._M_allocated_capacity + 1);
  }
  local_1f8 = (pointer)local_220._8_8_;
  uVar18 = (int)((long)(local_220._8_8_ - local_220._0_8_) >> 3) * -0x3b13b13b;
  this_00->mNumChildren = uVar18;
  uVar21 = (ulong)uVar18 << 3;
  __s = (aiNode **)operator_new__(uVar21);
  memset(__s,0,uVar21);
  this_00->mChildren = __s;
  __s_00 = (aiMesh **)operator_new__(uVar21);
  memset(__s_00,0,uVar21);
  local_228->mMeshes = __s_00;
  local_278.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (aiVector3t<float> *)0x0;
  local_278.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (aiVector3t<float> *)0x0;
  local_278.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (aiVector3t<float> *)0x0;
  local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pOVar34 = (pointer)local_220._0_8_;
  if ((pointer)local_220._0_8_ != local_1f8) {
    do {
      this_01 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(this_01,&pOVar34->name);
      *__s = this_01;
      this_01->mParent = this_00;
      local_1a8._8_8_ = local_1a8._8_8_ & 0xffffffff00000000;
      local_198._M_allocated_capacity = 0;
      local_198._8_8_ = local_1a8 + 8;
      uStack_180 = 0;
      uStack_17c = 0;
      pEVar30 = (pOVar34->edges).
                super__Vector_base<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pEVar6 = (pOVar34->edges).
               super__Vector_base<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_1e8 = __s;
      uStack_188 = (_Rb_tree_node_base *)local_198._8_8_;
      if (pEVar30 != pEVar6) {
        mVar31 = 0;
        do {
          pmVar22 = std::
                    map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                    ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                  *)local_1a8,pEVar30->edge + 2);
          *pmVar22 = mVar31;
          pmVar22 = std::
                    map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                    ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                  *)local_1a8,pEVar30->edge + 3);
          *pmVar22 = mVar31;
          mVar31 = mVar31 + 1;
          pEVar30 = pEVar30 + 1;
        } while (pEVar30 != pEVar6);
      }
      this_02 = (aiMesh *)operator_new(0x520);
      this_02->mPrimitiveTypes = 0;
      this_02->mNumVertices = 0;
      local_1f0 = &this_02->mVertices;
      memset(local_1f0,0,0xcc);
      this_02->mBones = (aiBone **)0x0;
      this_02->mMaterialIndex = 0;
      (this_02->mName).length = 0;
      (this_02->mName).data[0] = '\0';
      memset((this_02->mName).data + 1,0x1b,0x3ff);
      this_02->mNumAnimMeshes = 0;
      this_02->mAnimMeshes = (aiAnimMesh **)0x0;
      this_02->mMethod = 0;
      (this_02->mAABB).mMin.x = 0.0;
      (this_02->mAABB).mMin.y = 0.0;
      (this_02->mAABB).mMin.z = 0.0;
      (this_02->mAABB).mMax.x = 0.0;
      (this_02->mAABB).mMax.y = 0.0;
      (this_02->mAABB).mMax.z = 0.0;
      memset(this_02->mColors,0,0xa0);
      uVar18 = uStack_180;
      lVar29 = CONCAT44(uStack_17c,uStack_180);
      this_02->mNumFaces = uStack_180;
      uVar21 = (ulong)uStack_180;
      puVar23 = (ulong *)operator_new__(uVar21 * 0x10 + 8);
      *puVar23 = uVar21;
      paVar28 = (aiFace *)(puVar23 + 1);
      if (uVar18 != 0) {
        paVar24 = paVar28;
        do {
          paVar24->mNumIndices = 0;
          paVar24->mIndices = (uint *)0x0;
          paVar24 = paVar24 + 1;
        } while (paVar24 != paVar28 + uVar21);
      }
      this_02->mFaces = paVar28;
      if (local_278.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_278.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        local_278.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
        .super__Vector_impl_data._M_finish =
             local_278.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                (&local_278,lVar29 << 2);
      __src = local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
      uVar26 = local_198._8_8_;
      puVar32 = local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if ((_Rb_tree_node_base *)local_198._8_8_ != (_Rb_tree_node_base *)(local_1a8 + 8)) {
        do {
          if (puVar32 != __src) {
            local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = __src;
          }
          _Var3 = ((_Rb_tree_node_base *)(uVar26 + 0x20))->_M_color;
          uVar18 = *(uint *)&((_Rb_tree_node_base *)(uVar26 + 0x20))->field_0x4;
          local_258 = paVar28;
          do {
            pEVar30 = (pOVar34->edges).
                      super__Vector_base<Assimp::NDOImporter::Edge,_std::allocator<Assimp::NDOImporter::Edge>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar21 = (ulong)(_Var3 == pEVar30[uVar18].edge[3]);
            uVar19 = pEVar30[uVar18].edge[uVar21];
            uVar18 = pEVar30[uVar18].edge[uVar21 + 4];
            local_24c = (int)((ulong)((long)local_278.
                                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_278.
                                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                        -0x55555555;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      (&local_248,&local_24c);
            pVVar5 = (pOVar34->vertices).
                     super__Vector_base<Assimp::NDOImporter::Vertex,_std::allocator<Assimp::NDOImporter::Vertex>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            paVar27 = &pVVar5[uVar19].val;
            if (local_278.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_278.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
              _M_realloc_insert<aiVector3t<float>const&>
                        ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&local_278,
                         (iterator)
                         local_278.
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_finish,paVar27);
            }
            else {
              (local_278.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_finish)->z = pVVar5[uVar19].val.z;
              fVar35 = paVar27->y;
              (local_278.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_finish)->x = paVar27->x;
              (local_278.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_finish)->y = fVar35;
              local_278.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_278.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            puVar32 = local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            __src = local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start;
            paVar24 = local_258;
          } while (uVar18 != *(uint *)&((_Rb_tree_node_base *)(uVar26 + 0x20))->field_0x4);
          uVar21 = (long)local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start;
          local_258->mNumIndices = (uint)(uVar21 >> 2);
          puVar25 = (uint *)operator_new__(uVar21 & 0x3fffffffc);
          paVar24->mIndices = puVar25;
          if (puVar32 != __src) {
            memmove(puVar25,__src,uVar21);
          }
          uVar26 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar26);
          paVar28 = paVar28 + 1;
        } while ((_Rb_tree_node_base *)uVar26 != (_Rb_tree_node_base *)(local_1a8 + 8));
      }
      paVar9 = local_278.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      local_258 = (aiFace *)
                  local_278.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start;
      __n = (long)local_278.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_278.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start;
      uVar33 = ((long)__n >> 2) * -0x5555555555555555;
      uVar18 = (uint)uVar33;
      this_02->mNumVertices = uVar18;
      uVar33 = uVar33 & 0xffffffff;
      uVar21 = uVar33 * 0xc;
      paVar27 = (aiVector3D *)operator_new__(uVar21);
      if (uVar33 != 0) {
        memset(paVar27,0,((uVar21 - 0xc) / 0xc) * 0xc + 0xc);
      }
      *local_1f0 = paVar27;
      if ((aiFace *)paVar9 != local_258) {
        memmove(paVar27,local_258,__n);
      }
      if (uVar18 == 0) {
        aiMesh::~aiMesh(this_02);
        operator_delete(this_02,0x520);
      }
      else {
        local_228->mMeshes[local_228->mNumMeshes] = this_02;
        uVar18 = local_228->mNumMeshes;
        local_228->mNumMeshes = uVar18 + 1;
        this_01->mNumMeshes = 1;
        puVar25 = (uint *)operator_new__(4);
        this_01->mMeshes = puVar25;
        *puVar25 = uVar18;
      }
      __s = local_1e8 + 1;
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   *)local_1a8);
      pOVar34 = pOVar34 + 1;
      this_00 = local_200;
    } while (pOVar34 != local_1f8);
    if (local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_248.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_248.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  if (local_278.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (aiVector3t<float> *)0x0) {
    operator_delete(local_278.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_>::~vector
            ((vector<Assimp::NDOImporter::Object,_std::allocator<Assimp::NDOImporter::Object>_> *)
             local_220);
  StreamReader<true,_false>::~StreamReader(&local_1e0);
  return;
}

Assistant:

void NDOImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    StreamReaderBE reader(pIOHandler->Open( pFile, "rb"));

    // first 9 bytes are nendo file format ("nendo 1.n")
    const char* head = (const char*)reader.GetPtr();
    reader.IncPtr(9);

    if (strncmp("nendo ",head,6)) {
        throw DeadlyImportError("Not a Nendo file; magic signature missing");
    }
    // check if this is a supported version. if not, continue, too -- users,
    // please don't complain if it doesn't work then ...
    unsigned int file_format = 12;
    if (!strncmp("1.0",head+6,3)) {
        file_format = 10;
        ASSIMP_LOG_INFO("NDO file format is 1.0");
    }
    else if (!strncmp("1.1",head+6,3)) {
        file_format = 11;
        ASSIMP_LOG_INFO("NDO file format is 1.1");
    }
    else if (!strncmp("1.2",head+6,3)) {
        file_format = 12;
        ASSIMP_LOG_INFO("NDO file format is 1.2");
    }
    else {
        ASSIMP_LOG_WARN_F( "Unrecognized nendo file format version, continuing happily ... :", (head+6));
    }

    reader.IncPtr(2); /* skip flags */
    if (file_format >= 12) {
        reader.IncPtr(2);
    }
    unsigned int temp = reader.GetU1();

    std::vector<Object> objects(temp); /* buffer to store all the loaded objects in */

    // read all objects
    for (unsigned int o = 0; o < objects.size(); ++o) {

//      if (file_format < 12) {
            if (!reader.GetI1()) {
                continue; /* skip over empty object */
            }
        //  reader.GetI2();
//      }
        Object& obj = objects[o];

        temp = file_format >= 12 ? reader.GetU4() : reader.GetU2();
        head = (const char*)reader.GetPtr();
        reader.IncPtr(temp + 76); /* skip unknown stuff */

        obj.name = std::string(head, temp);

        // read edge table
        temp = file_format >= 12 ? reader.GetU4() : reader.GetU2();
        obj.edges.reserve(temp);
        for (unsigned int e = 0; e < temp; ++e) {

            obj.edges.push_back(Edge());
            Edge& edge = obj.edges.back();

            for (unsigned int i = 0; i< 8; ++i) {
                edge.edge[i] = file_format >= 12 ? reader.GetU4() : reader.GetU2();
            }
            edge.hard =  file_format >= 11 ? reader.GetU1() : 0;
            for (unsigned int i = 0; i< 8; ++i) {
                edge.color[i] = reader.GetU1();
            }
        }

        // read face table
        temp = file_format >= 12 ? reader.GetU4() : reader.GetU2();
        obj.faces.reserve(temp);
        for (unsigned int e = 0; e < temp; ++e) {

            obj.faces.push_back(Face());
            Face& face = obj.faces.back();

            face.elem = file_format >= 12 ? reader.GetU4() : reader.GetU2();
        }

        // read vertex table
        temp = file_format >= 12 ? reader.GetU4() : reader.GetU2();
        obj.vertices.reserve(temp);
        for (unsigned int e = 0; e < temp; ++e) {

            obj.vertices.push_back(Vertex());
            Vertex& v = obj.vertices.back();

            v.num = file_format >= 12 ? reader.GetU4() : reader.GetU2();
            v.val.x = reader.GetF4();
            v.val.y = reader.GetF4();
            v.val.z = reader.GetF4();
        }

        // read UVs
        temp = file_format >= 12 ? reader.GetU4() : reader.GetU2();
        for (unsigned int e = 0; e < temp; ++e) {
             file_format >= 12 ? reader.GetU4() : reader.GetU2();
        }

        temp = file_format >= 12 ? reader.GetU4() : reader.GetU2();
        for (unsigned int e = 0; e < temp; ++e) {
             file_format >= 12 ? reader.GetU4() : reader.GetU2();
        }

        if (reader.GetU1()) {
            const unsigned int x = reader.GetU2(), y = reader.GetU2();
            temp = 0;
            while (temp < x*y)  {
                unsigned int repeat = reader.GetU1();
                reader.GetU1();
                reader.GetU1();
                reader.GetU1();
                temp += repeat;
            }
        }
    }

    // construct a dummy node graph and add all named objects as child nodes
    aiNode* root = pScene->mRootNode = new aiNode("$NDODummyRoot");
    aiNode** cc = root->mChildren = new aiNode* [ root->mNumChildren = static_cast<unsigned int>( objects.size()) ] ();
    pScene->mMeshes = new aiMesh* [ root->mNumChildren] ();

    std::vector<aiVector3D> vertices;
    std::vector<unsigned int> indices;

    for(const Object& obj : objects) {
        aiNode* nd = *cc++ = new aiNode(obj.name);
        nd->mParent = root;

        // translated from a python dict() - a vector might be sufficient as well
        typedef std::map<unsigned int, unsigned int>  FaceTable;
        FaceTable face_table;

        unsigned int n = 0;
        for(const Edge& edge : obj.edges) {

            face_table[edge.edge[2]] = n;
            face_table[edge.edge[3]] = n;

            ++n;
        }

        aiMesh* mesh = new aiMesh();
        mesh->mNumFaces=static_cast<unsigned int>(face_table.size());
        aiFace* faces = mesh->mFaces = new aiFace[mesh->mNumFaces];

        vertices.clear();
        vertices.reserve(4 * face_table.size()); // arbitrarily chosen
        for(FaceTable::value_type& v : face_table) {
            indices.clear();

            aiFace& f = *faces++;

            const unsigned int key = v.first;
            unsigned int cur_edge = v.second;
            while (1) {
                unsigned int next_edge, next_vert;
                if (key == obj.edges[cur_edge].edge[3]) {
                    next_edge = obj.edges[cur_edge].edge[5];
                    next_vert = obj.edges[cur_edge].edge[1];
                }
                else {
                    next_edge = obj.edges[cur_edge].edge[4];
                    next_vert = obj.edges[cur_edge].edge[0];
                }
                indices.push_back( static_cast<unsigned int>(vertices.size()) );
                vertices.push_back(obj.vertices[ next_vert ].val);

                cur_edge = next_edge;
                if (cur_edge == v.second) {
                    break;
                }
            }

            f.mIndices = new unsigned int[f.mNumIndices = static_cast<unsigned int>(indices.size())];
            std::copy(indices.begin(),indices.end(),f.mIndices);
        }

        mesh->mVertices = new aiVector3D[mesh->mNumVertices = static_cast<unsigned int>(vertices.size())];
        std::copy(vertices.begin(),vertices.end(),mesh->mVertices);

        if (mesh->mNumVertices) {
            pScene->mMeshes[pScene->mNumMeshes] = mesh;

            (nd->mMeshes = new unsigned int[nd->mNumMeshes=1])[0]=pScene->mNumMeshes++;
        }else
            delete mesh;
    }
}